

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cc
# Opt level: O3

int main(void)

{
  void *__buf;
  FILE *__n;
  Pl_ASCIIHexDecoder decode;
  Pl_StdioFile out;
  uchar buf [10000];
  Pl_ASCIIHexDecoder local_27a8;
  Pl_StdioFile local_2760;
  undefined1 local_2728 [10000];
  
  Pl_StdioFile::Pl_StdioFile(&local_2760,"stdout",_stdout);
  Pl_ASCIIHexDecoder::Pl_ASCIIHexDecoder(&local_27a8,"decode",&local_2760.super_Pipeline);
  while( true ) {
    __n = _stdin;
    __buf = (void *)fread(local_2728,1,10000,_stdin);
    if (__buf == (void *)0x0) break;
    Pl_ASCIIHexDecoder::write(&local_27a8,(int)local_2728,__buf,(size_t)__n);
  }
  Pl_ASCIIHexDecoder::finish(&local_27a8);
  local_27a8.super_Pipeline._vptr_Pipeline = (_func_int **)&PTR__Pipeline_002e9b60;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_27a8.super_Pipeline.identifier._M_dataplus._M_p !=
      &local_27a8.super_Pipeline.identifier.field_2) {
    operator_delete(local_27a8.super_Pipeline.identifier._M_dataplus._M_p,
                    local_27a8.super_Pipeline.identifier.field_2._M_allocated_capacity + 1);
  }
  Pl_StdioFile::~Pl_StdioFile(&local_2760);
  return 0;
}

Assistant:

int
main()
{
    Pl_StdioFile out("stdout", stdout);
    Pl_ASCIIHexDecoder decode("decode", &out);

    try {
        unsigned char buf[10000];
        bool done = false;
        while (!done) {
            size_t len = fread(buf, 1, sizeof(buf), stdin);
            if (len <= 0) {
                done = true;
            } else {
                decode.write(buf, len);
            }
        }
        decode.finish();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
        exit(2);
    }

    return 0;
}